

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

void __thiscall S2LaxPolygonShape::S2LaxPolygonShape(S2LaxPolygonShape *this,S2Polygon *polygon)

{
  S2Polygon *polygon_local;
  S2LaxPolygonShape *this_local;
  
  S2Shape::S2Shape(&this->super_S2Shape);
  (this->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2LaxPolygonShape_0062e080;
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  unique_ptr<std::default_delete<Vector3<double>[]>,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_);
  Init(this,polygon);
  return;
}

Assistant:

S2LaxPolygonShape::S2LaxPolygonShape(const S2Polygon& polygon) {
  Init(polygon);
}